

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GeneratePBHeader
          (FileGenerator *this,Printer *p,string_view info_path)

{
  Printer *p_local;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  string_view info_path_local;
  
  info_path_local._M_str = info_path._M_str;
  info_path_local._M_len = info_path._M_len;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  p_local = p;
  local_48._M_unused._M_object = operator_new(0x18);
  *(Printer ***)local_48._M_unused._0_8_ = &p_local;
  *(FileGenerator **)((long)local_48._M_unused._0_8_ + 8) = this;
  *(string_view **)((long)local_48._M_unused._0_8_ + 0x10) = &info_path_local;
  pcStack_30 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/cpp/file.cc:350:44)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/cpp/file.cc:350:44)>
             ::_M_manager;
  GenerateFile(this,p,kPbH,(function<void_()> *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return;
}

Assistant:

void FileGenerator::GeneratePBHeader(io::Printer* p,
                                     absl::string_view info_path) {
  GenerateFile(p, GeneratedFileType::kPbH, [&] {
    p->Emit(
        {
            {"library_includes",
             [&] {
               if (options_.proto_h) {
                 std::string target_basename = StripProto(file_->name());
                 if (!options_.opensource_runtime) {
                   GetBootstrapBasename(options_, target_basename,
                                        &target_basename);
                 }
                 p->Emit({{"name", target_basename}}, R"(
              #include "$name$.proto.h"  // IWYU pragma: export
              )");
               } else {
                 GenerateLibraryIncludes(p);
               }
             }},
            {"proto_includes",
             [&] {
               if (options_.transitive_pb_h) {
                 GenerateDependencyIncludes(p);
               }
             }},
            {"metadata_pragma", [&] { GenerateMetadataPragma(p, info_path); }},
            {"header_main",
             [&] {
               if (!options_.proto_h) {
                 GenerateSharedHeaderCode(p);
                 return;
               }

               {
                 NamespaceOpener ns(Namespace(file_, options_), p);
                 p->Emit(R"cc(

                   // @@protoc_insertion_point(namespace_scope)
                 )cc");
               }
               p->Emit(R"cc(

                 // @@protoc_insertion_point(global_scope)
               )cc");
             }},
        },
        R"cc(
          $library_includes$;
          $proto_includes$;
          // @@protoc_insertion_point(includes)

          $metadata_pragma$;
          $header_main$;
        )cc");
  });
}